

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O1

void __thiscall
QEvdevTabletHandlerThread::QEvdevTabletHandlerThread
          (QEvdevTabletHandlerThread *this,QString *device,QString *spec,QObject *parent)

{
  Data *pDVar1;
  
  QDaemonThread::QDaemonThread(&this->super_QDaemonThread,parent);
  *(undefined ***)this = &PTR_metaObject_0010e668;
  pDVar1 = (device->d).d;
  (this->m_device).d.d = pDVar1;
  (this->m_device).d.ptr = (device->d).ptr;
  (this->m_device).d.size = (device->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar1 = (spec->d).d;
  (this->m_spec).d.d = pDVar1;
  (this->m_spec).d.ptr = (spec->d).ptr;
  (this->m_spec).d.size = (spec->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->m_handler = (QEvdevTabletHandler *)0x0;
  QThread::start(this,7);
  return;
}

Assistant:

QEvdevTabletHandlerThread::QEvdevTabletHandlerThread(const QString &device, const QString &spec, QObject *parent)
    : QDaemonThread(parent), m_device(device), m_spec(spec), m_handler(0)
{
    start();
}